

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_protectedparser(lua_State *L,ZIO *z,char *name)

{
  int iVar1;
  ptrdiff_t in_RDX;
  void *in_RSI;
  Pfunc in_RDI;
  int status;
  lua_State *unaff_retaddr;
  SParser p;
  undefined4 in_stack_ffffffffffffffb8;
  void *block;
  lua_State *in_stack_ffffffffffffffd0;
  
  block = (void *)0x0;
  iVar1 = luaD_pcall(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RDX);
  luaM_realloc_(in_stack_ffffffffffffffd0,block,(size_t)in_RSI,
                CONCAT44(iVar1,in_stack_ffffffffffffffb8));
  return iVar1;
}

Assistant:

static int luaD_protectedparser(lua_State*L,ZIO*z,const char*name){
struct SParser p;
int status;
p.z=z;p.name=name;
luaZ_initbuffer(L,&p.buff);
status=luaD_pcall(L,f_parser,&p,savestack(L,L->top),L->errfunc);
luaZ_freebuffer(L,&p.buff);
return status;
}